

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaTreeItemPtr_conflict
xmlSchemaGetCircModelGrDefRef
          (xmlSchemaModelGroupDefPtr groupDef,xmlSchemaTreeItemPtr_conflict particle)

{
  xmlSchemaModelGroupDefPtr pxVar1;
  xmlSchemaTreeItemPtr_conflict pxVar2;
  xmlSchemaModelGroupDefPtr gdef;
  xmlSchemaTreeItemPtr_conflict term;
  xmlSchemaTreeItemPtr_conflict circ;
  xmlSchemaTreeItemPtr_conflict particle_local;
  xmlSchemaModelGroupDefPtr groupDef_local;
  
  circ = particle;
  do {
    if (circ == (xmlSchemaTreeItemPtr_conflict)0x0) {
      return (xmlSchemaTreeItemPtr_conflict)0x0;
    }
    pxVar1 = (xmlSchemaModelGroupDefPtr)circ->children;
    if (pxVar1 != (xmlSchemaModelGroupDefPtr)0x0) {
      if (pxVar1->type - XML_SCHEMA_TYPE_SEQUENCE < 3) {
        pxVar2 = xmlSchemaGetCircModelGrDefRef(groupDef,pxVar1->children);
joined_r0x001ee8bd:
        if (pxVar2 != (xmlSchemaTreeItemPtr_conflict)0x0) {
          return pxVar2;
        }
      }
      else if (pxVar1->type == XML_SCHEMA_TYPE_GROUP) {
        if (pxVar1 == groupDef) {
          return circ;
        }
        if (((pxVar1->flags & 1U) == 0) && (pxVar1->children != (xmlSchemaTreeItemPtr_conflict)0x0))
        {
          pxVar1->flags = pxVar1->flags | 1;
          pxVar2 = xmlSchemaGetCircModelGrDefRef(groupDef,pxVar1->children->children);
          pxVar1->flags = pxVar1->flags ^ 1;
          goto joined_r0x001ee8bd;
        }
      }
    }
    circ = circ->next;
  } while( true );
}

Assistant:

static xmlSchemaTreeItemPtr
xmlSchemaGetCircModelGrDefRef(xmlSchemaModelGroupDefPtr groupDef,
			      xmlSchemaTreeItemPtr particle)
{
    xmlSchemaTreeItemPtr circ = NULL;
    xmlSchemaTreeItemPtr term;
    xmlSchemaModelGroupDefPtr gdef;

    for (; particle != NULL; particle = particle->next) {
	term = particle->children;
	if (term == NULL)
	    continue;
	switch (term->type) {
	    case XML_SCHEMA_TYPE_GROUP:
		gdef = (xmlSchemaModelGroupDefPtr) term;
		if (gdef == groupDef)
		    return (particle);
		/*
		* Mark this model group definition to avoid infinite
		* recursion on circular references not yet examined.
		*/
		if (gdef->flags & XML_SCHEMA_MODEL_GROUP_DEF_MARKED)
		    continue;
		if (gdef->children != NULL) {
		    gdef->flags |= XML_SCHEMA_MODEL_GROUP_DEF_MARKED;
		    circ = xmlSchemaGetCircModelGrDefRef(groupDef,
			gdef->children->children);
		    gdef->flags ^= XML_SCHEMA_MODEL_GROUP_DEF_MARKED;
		    if (circ != NULL)
			return (circ);
		}
		break;
	    case XML_SCHEMA_TYPE_SEQUENCE:
	    case XML_SCHEMA_TYPE_CHOICE:
	    case XML_SCHEMA_TYPE_ALL:
		circ = xmlSchemaGetCircModelGrDefRef(groupDef, term->children);
		if (circ != NULL)
		    return (circ);
		break;
	    default:
		break;
	}
    }
    return (NULL);
}